

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

BoxList * __thiscall amrex::BoxList::parallelComplementIn(BoxList *this,Box *b,BoxArray *ba)

{
  pointer *ppBVar1;
  int iVar2;
  element_type *peVar3;
  Box *pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  iterator __position;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  ulong uVar15;
  BoxList BStack_d8;
  uint uStack_ac;
  BoxList BStack_a8;
  long lStack_80;
  Box BStack_78;
  ulong uStack_58;
  undefined8 uStack_50;
  ulong uStack_48;
  undefined8 uStack_40;
  
  peVar3 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar4 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = ((long)*(pointer *)
                   ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data + 8) - (long)pBVar4 >> 2) * 0x6db6db6db6db6db7;
  if (lVar10 == 1) {
    BATransformer::operator()((Box *)&BStack_a8,&ba->m_bat,pBVar4);
    boxDiff(&BStack_d8,b,(Box *)&BStack_a8);
    pBVar5 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar6 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pBVar5 == (pointer)0x0) {
      (this->btype).itype = BStack_d8.btype.itype;
      return this;
    }
    operator_delete(pBVar5,(long)pBVar6 - (long)pBVar5);
    (this->btype).itype = BStack_d8.btype.itype;
  }
  else {
    if (lVar10 == 0) {
      pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current != pBVar4) {
        (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = pBVar4;
        __position._M_current = pBVar4;
      }
      if (__position._M_current !=
          (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        uVar7 = *(undefined8 *)(b->smallend).vect;
        uVar8 = *(undefined8 *)((b->smallend).vect + 2);
        uVar9 = *(undefined8 *)((b->bigend).vect + 2);
        *(undefined8 *)((__position._M_current)->bigend).vect = *(undefined8 *)(b->bigend).vect;
        *(undefined8 *)(((__position._M_current)->bigend).vect + 2) = uVar9;
        *(undefined8 *)((__position._M_current)->smallend).vect = uVar7;
        *(undefined8 *)(((__position._M_current)->smallend).vect + 2) = uVar8;
        ppBVar1 = &(this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
        return this;
      }
      std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)this,__position,b);
      return this;
    }
    BoxArray::minimalBox(&BStack_78,ba,&lStack_80);
    boxDiff(&BStack_d8,b,&BStack_78);
    pBVar5 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar6 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pBVar5 == (pointer)0x0) {
      (this->btype).itype = BStack_d8.btype.itype;
    }
    else {
      operator_delete(pBVar5,(long)pBVar6 - (long)pBVar5);
      (this->btype).itype = BStack_d8.btype.itype;
      if (BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start);
        BStack_d8.btype.itype = (this->btype).itype;
      }
    }
    iVar11 = (b->smallend).vect[2];
    iVar2 = (b->bigend).vect[2];
    if (iVar11 < BStack_78.smallend.vect[2]) {
      iVar11 = BStack_78.smallend.vect[2];
    }
    if (BStack_78.bigend.vect[2] < iVar2) {
      iVar2 = BStack_78.bigend.vect[2];
    }
    uVar13 = *(ulong *)(b->bigend).vect;
    uVar15 = CONCAT44(-(uint)(BStack_78.bigend.vect[1] < (int)(uVar13 >> 0x20)),
                      -(uint)(BStack_78.bigend.vect[0] < (int)uVar13));
    uStack_48 = ~uVar15 & uVar13 | BStack_78.bigend.vect._0_8_ & uVar15;
    uStack_40 = 0;
    uVar13 = *(ulong *)(b->smallend).vect;
    uVar15 = CONCAT44(-(uint)((int)(uVar13 >> 0x20) < BStack_78.smallend.vect[1]),
                      -(uint)((int)uVar13 < BStack_78.smallend.vect[0]));
    uStack_58 = ~uVar15 & uVar13 | BStack_78.smallend.vect._0_8_ & uVar15;
    uStack_50 = 0;
    uStack_ac = BStack_d8.btype.itype;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x1c);
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
    *(ulong *)((BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start)->smallend).vect = uStack_58;
    ((BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
     _M_start)->smallend).vect[2] = iVar11;
    *(ulong *)((BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start)->bigend).vect = uStack_48;
    ((BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
     _M_start)->bigend).vect[2] = iVar2;
    ((BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
     _M_start)->btype).itype = BStack_78.btype.itype;
    BStack_d8.btype.itype = BStack_78.btype.itype;
    BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    dVar14 = cbrt((double)lStack_80);
    dVar14 = ceil(dVar14 * 0.25);
    iVar11 = 1;
    if (1 < (int)dVar14 * 4) {
      iVar11 = (int)dVar14 * 4;
    }
    iVar11 = iVar11 << 2;
    BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(iVar11,iVar11);
    BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(BStack_a8.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar11);
    maxSize(&BStack_d8,(IntVect *)&BStack_a8);
    uVar12 = (int)((long)BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x49249249;
    BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BStack_a8.btype.itype = uStack_ac;
    if (0 < (int)uVar12) {
      uVar13 = (ulong)(uVar12 & 0x7fffffff);
      lVar10 = 0;
      do {
        BoxArray::complementIn
                  (ba,&BStack_a8,
                   (Box *)((long)((BStack_d8.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->smallend).vect +
                          lVar10));
        std::vector<amrex::Box,std::allocator<amrex::Box>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)this,
                   (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        lVar10 = lVar10 + 0x1c;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      if (BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)BStack_a8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  if (BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

BoxList&
BoxList::parallelComplementIn (const Box& b, BoxArray const& ba)
{
    BL_PROFILE("BoxList::parallelComplementIn()");
#ifndef AMREX_USE_MPI
    return complementIn(b,ba);
#else
    if (ba.size() <= 8)
    {
        return complementIn(b,ba);
    }
    else
    {
        BL_PROFILE_VAR("BoxList::pci", boxlistpci);

        Long npts_avgbox;
        Box mbox = ba.minimalBox(npts_avgbox);
        *this = amrex::boxDiff(b, mbox);
        auto mytyp = ixType();

        BoxList bl_mesh(mbox & b);

#if (AMREX_SPACEDIM == 1)
        Real s_avgbox = static_cast<Real>(npts_avgbox);
#elif (AMREX_SPACEDIM == 2)
        Real s_avgbox = static_cast<Real>(std::sqrt(npts_avgbox));
#elif (AMREX_SPACEDIM == 3)
        Real s_avgbox = static_cast<Real>(std::cbrt(npts_avgbox));
#endif

        const int block_size = 4 * std::max(1,static_cast<int>(std::ceil(s_avgbox/4.))*4);
        bl_mesh.maxSize(block_size);
        const int N = bl_mesh.size();

        const int nprocs = ParallelContext::NProcsSub();
        const int myproc = ParallelContext::MyProcSub();
        const int navg = N / nprocs;
        const int nextra = N - navg*nprocs;
        const int ilo = (myproc < nextra) ? myproc*(navg+1) : myproc*navg+nextra;
        const int ihi = (myproc < nextra) ? ilo+navg+1-1 : ilo+navg-1;

        Vector<Box> local_boxes;

#ifdef AMREX_USE_OMP
        bool start_omp_parallel = !omp_in_parallel();
        const int nthreads = omp_get_max_threads();
#else
        bool start_omp_parallel = false;
#endif

        if (start_omp_parallel)
        {
#ifdef AMREX_USE_OMP
            Vector<BoxList> bl_priv(nthreads, BoxList(mytyp));
            int ntot = 0;
#pragma omp parallel reduction(+:ntot)
            {
                BoxList bl_tmp(mytyp);
                auto& vbox = bl_priv[omp_get_thread_num()].m_lbox;
#pragma omp for
                for (int i = ilo; i <= ihi; ++i)
                {
                    ba.complementIn(bl_tmp, bl_mesh.m_lbox[i]);
                    vbox.insert(std::end(vbox), std::begin(bl_tmp), std::end(bl_tmp));
                }
                ntot += bl_tmp.size();
            }
            local_boxes.reserve(ntot);
            for (auto& bl : bl_priv) {
                local_boxes.insert(std::end(local_boxes), std::begin(bl), std::end(bl));
            }
#else
            amrex::Abort("BoxList::complementIn: how did this happen");
#endif
        }
        else
        {
            BoxList bl_tmp(mytyp);
            for (int i = ilo; i <= ihi; ++i)
            {
                ba.complementIn(bl_tmp, bl_mesh.m_lbox[i]);
                local_boxes.insert(std::end(local_boxes), std::begin(bl_tmp), std::end(bl_tmp));
            }
        }

        amrex::AllGatherBoxes(local_boxes, this->size());
        local_boxes.insert(std::end(local_boxes), std::begin(m_lbox), std::end(m_lbox));
        std::swap(m_lbox, local_boxes);

        return *this;
    }
#endif
}